

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O3

el_action_t vi_to_history_line(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  el_action_t eVar2;
  wchar_t wVar3;
  
  wVar1 = (el->el_history).eventno;
  if (wVar1 == L'\0') {
    wcsncpy((el->el_history).buf,(el->el_line).buffer,0x400);
    (el->el_history).last =
         (wchar_t *)
         ((long)(el->el_line).lastchar + ((long)(el->el_history).buf - (long)(el->el_line).buffer));
  }
  if ((el->el_state).doingarg == L'\0') {
    (el->el_history).eventno = L'\x7fffffff';
    hist_get(el);
  }
  else {
    (el->el_history).eventno = L'\x01';
    eVar2 = hist_get(el);
    if (eVar2 == '\x06') {
      return '\x06';
    }
    wVar3 = ((el->el_history).ev.num - (el->el_state).argument) + L'\x01';
    (el->el_history).eventno = wVar3;
    if (wVar3 < L'\0') goto LAB_0011f115;
  }
  eVar2 = hist_get(el);
  if (eVar2 != '\x06') {
    return eVar2;
  }
LAB_0011f115:
  (el->el_history).eventno = wVar1;
  return '\x06';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_to_history_line(EditLine *el, wint_t c __attribute__((__unused__)))
{
	int sv_event_no = el->el_history.eventno;
	el_action_t rval;


	if (el->el_history.eventno == 0) {
		 (void) wcsncpy(el->el_history.buf, el->el_line.buffer,
		     EL_BUFSIZ);
		 el->el_history.last = el->el_history.buf +
			 (el->el_line.lastchar - el->el_line.buffer);
	}

	/* Lack of a 'count' means oldest, not 1 */
	if (!el->el_state.doingarg) {
		el->el_history.eventno = 0x7fffffff;
		hist_get(el);
	} else {
		/* This is brain dead, all the rest of this code counts
		 * upwards going into the past.  Here we need count in the
		 * other direction (to match the output of fc -l).
		 * I could change the world, but this seems to suffice.
		 */
		el->el_history.eventno = 1;
		if (hist_get(el) == CC_ERROR)
			return CC_ERROR;
		el->el_history.eventno = 1 + el->el_history.ev.num
					- el->el_state.argument;
		if (el->el_history.eventno < 0) {
			el->el_history.eventno = sv_event_no;
			return CC_ERROR;
		}
	}
	rval = hist_get(el);
	if (rval == CC_ERROR)
		el->el_history.eventno = sv_event_no;
	return rval;
}